

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

uint __thiscall QXmlStreamReaderPrivate::filterCarriageReturn(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  uint *__ptr;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (this->putStack).tos;
  if (lVar3 == -1) {
    if (this->readBufferPos < (this->readBuffer).d.size) {
      uVar2 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
    }
    else {
      uVar2 = getChar_helper(this);
      if (uVar2 == 0xffffffff) goto LAB_0039a6e0;
      this->readBufferPos = this->readBufferPos + -1;
    }
  }
  else {
    uVar2 = (this->putStack).data[lVar3];
  }
  if (uVar2 != 0xffffffff) {
    if (uVar2 != 10) {
      return 10;
    }
    lVar3 = (this->putStack).tos;
    if (lVar3 != -1) {
      (this->putStack).tos = lVar3 + -1;
      return 10;
    }
    this->readBufferPos = this->readBufferPos + 1;
    return 10;
  }
LAB_0039a6e0:
  __ptr = (this->putStack).data;
  lVar4 = (this->putStack).tos;
  lVar3 = lVar4 + 1;
  lVar1 = (this->putStack).cap;
  if (lVar1 <= lVar3) {
    lVar4 = lVar4 + 2;
    lVar3 = lVar1 * 2;
    if (lVar4 != lVar3 && SBORROW8(lVar4,lVar3) == lVar4 + lVar1 * -2 < 0) {
      lVar3 = lVar4;
    }
    (this->putStack).cap = lVar3;
    __ptr = (uint *)realloc(__ptr,lVar3 << 2);
    (this->putStack).data = __ptr;
    if (__ptr == (uint *)0x0) {
      qBadAlloc();
    }
    lVar3 = (this->putStack).tos + 1;
  }
  (this->putStack).tos = lVar3;
  __ptr[lVar3] = 0xd;
  return 0;
}

Assistant:

inline uint QXmlStreamReaderPrivate::filterCarriageReturn()
{
    uint peekc = peekChar();
    if (peekc == '\n') {
        if (putStack.size())
            putStack.pop();
        else
            ++readBufferPos;
        return peekc;
    }
    if (peekc == StreamEOF) {
        putChar('\r');
        return 0;
    }
    return '\n';
}